

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

char * getLinkInterfaceDependentProperty<char_const*>
                 (cmGeneratorTarget *tgt,string *prop,string *config,CompatibleType t,char **param_5
                 )

{
  char *pcVar1;
  
  switch(t) {
  case BoolType:
    __assert_fail("false && \"String compatibility check function called for boolean\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0xdff,
                  "const char *getLinkInterfaceDependentProperty(const cmGeneratorTarget *, const std::string &, const std::string &, CompatibleType, const char **)"
                 );
  case StringType:
    pcVar1 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty(tgt,prop,config);
    return pcVar1;
  case NumberMinType:
    pcVar1 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty(tgt,prop,config);
    return pcVar1;
  case NumberMaxType:
    pcVar1 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty(tgt,prop,config);
    return pcVar1;
  default:
    __assert_fail("false && \"Unreachable!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0xe08,
                  "const char *getLinkInterfaceDependentProperty(const cmGeneratorTarget *, const std::string &, const std::string &, CompatibleType, const char **)"
                 );
  }
}

Assistant:

const char* getLinkInterfaceDependentProperty(cmGeneratorTarget const* tgt,
                                              const std::string& prop,
                                              const std::string& config,
                                              CompatibleType t,
                                              const char** /*unused*/)
{
  switch (t) {
    case BoolType:
      assert(false &&
             "String compatibility check function called for boolean");
      return CM_NULLPTR;
    case StringType:
      return tgt->GetLinkInterfaceDependentStringProperty(prop, config);
    case NumberMinType:
      return tgt->GetLinkInterfaceDependentNumberMinProperty(prop, config);
    case NumberMaxType:
      return tgt->GetLinkInterfaceDependentNumberMaxProperty(prop, config);
  }
  assert(false && "Unreachable!");
  return CM_NULLPTR;
}